

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::SerializePartialToZeroCopyStream
          (MessageLite *this,ZeroCopyOutputStream *output)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar3;
  EpsCopyOutputStream stream;
  LogMessage local_70 [16];
  ulong local_60;
  EpsCopyOutputStream local_58;
  
  iVar2 = (*this->_vptr_MessageLite[3])();
  local_60 = CONCAT44(extraout_var,iVar2);
  if ((local_60 & 0xffffffff80000000) == 0) {
    local_58.is_serialization_deterministic_ =
         (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
    local_58.end_ = local_58.buffer_;
    local_58.had_error_ = false;
    local_58.aliasing_enabled_ = false;
    local_58.skip_check_consistency = false;
    local_58.buffer_end_ = local_58.end_;
    local_58.stream_ = output;
    iVar2 = (*this->_vptr_MessageLite[5])(this,local_58.end_,&local_58);
    io::EpsCopyOutputStream::Trim(&local_58,(uint8_t *)CONCAT44(extraout_var_00,iVar2));
    bVar1 = local_58.had_error_ ^ 1;
  }
  else {
    absl::lts_20240722::log_internal::LogMessage::LogMessage
              (local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/message_lite.cc"
               ,0x216);
    GetTypeName_abi_cxx11_((GetTypeNameReturnType *)&local_58,this);
    uVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<(local_70,(string *)&local_58);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (uVar3,0x28," exceeded maximum protobuf size of 2GB: ");
    _ZN4absl12lts_2024072212log_internal10LogMessagelsImTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
              (uVar3);
    SerializePartialToZeroCopyStream();
    bVar1 = 0;
  }
  return (bool)bVar1;
}

Assistant:

bool MessageLite::SerializePartialToZeroCopyStream(
    io::ZeroCopyOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    ABSL_LOG(ERROR) << GetTypeName()
                    << " exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  uint8_t* target;
  io::EpsCopyOutputStream stream(
      output, io::CodedOutputStream::IsDefaultSerializationDeterministic(),
      &target);
  target = _InternalSerialize(target, &stream);
  stream.Trim(target);
  if (stream.HadError()) return false;
  return true;
}